

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

UEnumeration * ucol_openAvailableLocales_63(UErrorCode *status)

{
  UBool UVar1;
  StringEnumeration *adopted;
  StringEnumeration *s;
  UErrorCode *status_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    adopted = icu_63::Collator::getAvailableLocales();
    if (adopted == (StringEnumeration *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      status_local = (UErrorCode *)0x0;
    }
    else {
      status_local = (UErrorCode *)uenum_openFromStringEnumeration_63(adopted,status);
    }
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (UEnumeration *)status_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ucol_openAvailableLocales(UErrorCode *status) {
    // This is a wrapper over Collator::getAvailableLocales()
    if (U_FAILURE(*status)) {
        return NULL;
    }
    StringEnumeration *s = icu::Collator::getAvailableLocales();
    if (s == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    return uenum_openFromStringEnumeration(s, status);
}